

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# View.cpp
# Opt level: O3

void __thiscall sf::View::View(View *this,FloatRect *rectangle)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  *(undefined8 *)&(this->m_size).y = 0;
  (this->m_viewport).left = 0.0;
  (this->m_viewport).top = 0.0;
  (this->m_center).x = 0.0;
  (this->m_center).y = 0.0;
  (this->m_size).x = 0.0;
  (this->m_size).y = 0.0;
  (this->m_viewport).width = 1.0;
  (this->m_viewport).height = 1.0;
  Transform::Transform(&this->m_transform);
  Transform::Transform(&this->m_inverseTransform);
  uVar1 = rectangle->left;
  uVar3 = rectangle->top;
  uVar2 = rectangle->width;
  uVar4 = rectangle->height;
  (this->m_center).x = (float)uVar2 * 0.5 + (float)uVar1;
  (this->m_center).y = (float)uVar4 * 0.5 + (float)uVar3;
  (this->m_size).x = (float)uVar2;
  (this->m_size).y = (float)uVar4;
  this->m_rotation = 0.0;
  this->m_transformUpdated = false;
  this->m_invTransformUpdated = false;
  return;
}

Assistant:

View::View(const FloatRect& rectangle) :
m_center             (),
m_size               (),
m_rotation           (0),
m_viewport           (0, 0, 1, 1),
m_transformUpdated   (false),
m_invTransformUpdated(false)
{
    reset(rectangle);
}